

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv)

{
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT sum_6;
  REF_INT ge2_6;
  REF_INT ge1_11;
  REF_INT ge0_11;
  REF_INT sum_5;
  REF_INT ge2_5;
  REF_INT ge1_10;
  REF_INT ge0_10;
  REF_INT ge1_9;
  REF_INT ge0_9;
  REF_INT ge1_8;
  REF_INT ge0_8;
  REF_INT ge1_7;
  REF_INT ge0_7;
  REF_INT ge1_6;
  REF_INT ge0_6;
  REF_INT ge1_5;
  REF_INT ge0_5;
  REF_INT sum_4;
  REF_INT ge5;
  REF_INT ge4;
  REF_INT ge3;
  REF_INT ge2_4;
  REF_INT ge1_4;
  REF_INT ge0_4;
  REF_INT sum_3;
  REF_INT ge2_3;
  REF_INT ge1_3;
  REF_INT ge0_3;
  REF_INT sum_2;
  REF_INT ge2_2;
  REF_INT ge1_2;
  REF_INT ge0_2;
  REF_INT sum_1;
  REF_INT ge2_1;
  REF_INT ge1_1;
  REF_INT ge0_1;
  REF_INT sum;
  REF_INT ge2;
  REF_INT ge1;
  REF_INT ge0;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL again;
  REF_CELL ref_cell;
  REF_INT nmark;
  REF_INT nsweeps;
  REF_INT cell;
  REF_INT group;
  REF_SUBDIV ref_subdiv_local;
  
  _cell = ref_subdiv;
  uVar3 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar3 == 0) {
    ref_cell._4_4_ = 0;
    ge0 = 1;
    do {
      if (ge0 == 0) {
        if (_cell->instrument != 0) {
          uVar3 = ref_subdiv_mark_n(_cell,(REF_INT *)&ref_cell);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x1a7,"ref_subdiv_mark_relax",(ulong)uVar3,"count");
            return uVar3;
          }
          if (_cell->grid->mpi->id == 0) {
            printf(" %d edges marked after %d relaxations\n",(ulong)(uint)ref_cell,
                   (ulong)ref_cell._4_4_);
          }
        }
        return 0;
      }
      ref_cell._4_4_ = ref_cell._4_4_ + 1;
      ge0 = 0;
      nsweeps = 8;
      _ref_private_macro_code_rss = _cell->grid->cell[8];
      while (nsweeps < 0x10) {
        for (nmark = 0; nmark < _ref_private_macro_code_rss->max; nmark = nmark + 1) {
          if (((-1 < nmark) && (nmark < _ref_private_macro_code_rss->max)) &&
             (_ref_private_macro_code_rss->c2n[_ref_private_macro_code_rss->size_per * nmark] != -1)
             ) {
            iVar1 = _ref_private_macro_code_rss->node_per;
            if (iVar1 == 4) {
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,4,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,5,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,2,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,5,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,2,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,4,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,2,nmark);
              RVar4 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
              RVar5 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,4,nmark);
              RVar6 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,5,nmark);
              if ((_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] + _cell->mark[RVar4]
                   + _cell->mark[RVar5] + _cell->mark[RVar6] == 2) &&
                 ((((0 < RVar7 && (0 < RVar6)) || ((0 < RVar8 && (0 < RVar5)))) ||
                  ((0 < RVar9 && (3 < RVar8)))))) {
                ge0 = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
                pRVar2[RVar7] = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
                pRVar2[RVar7] = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,2,nmark);
                pRVar2[RVar7] = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
                pRVar2[RVar7] = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,4,nmark);
                pRVar2[RVar7] = 1;
                pRVar2 = _cell->mark;
                RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,5,nmark);
                pRVar2[RVar7] = 1;
              }
            }
            else if (iVar1 == 5) {
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,7,nmark);
              if (_cell->mark[RVar7] != _cell->mark[RVar8]) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,2,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,4,nmark);
              if (_cell->mark[RVar7] != _cell->mark[RVar8]) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
              }
            }
            else {
              if (iVar1 != 6) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x199,"ref_subdiv_mark_relax",6,"implement cell type");
                return 6;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,6,nmark);
              if (_cell->mark[RVar7] != _cell->mark[RVar8]) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,8,nmark);
              if (_cell->mark[RVar7] != _cell->mark[RVar8]) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,7,nmark);
              if (_cell->mark[RVar7] != _cell->mark[RVar8]) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,0,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,1,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,3,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
              RVar7 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,6,nmark);
              RVar8 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,7,nmark);
              RVar9 = ref_subdiv_c2e(_cell,_ref_private_macro_code_rss,8,nmark);
              if (_cell->mark[RVar7] + _cell->mark[RVar8] + _cell->mark[RVar9] == 2) {
                ge0 = 1;
                _cell->mark[RVar7] = 1;
                _cell->mark[RVar8] = 1;
                _cell->mark[RVar9] = 1;
              }
            }
          }
        }
        nsweeps = nsweeps + 1;
        _ref_private_macro_code_rss = _cell->grid->cell[nsweeps];
      }
      uVar3 = ref_edge_ghost_int(_cell->edge,_cell->grid->mpi,_cell->mark);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x1a1,"ref_subdiv_mark_relax",(ulong)uVar3,"ghost mark");
        return uVar3;
      }
      ref_subdiv_local._4_4_ = ref_mpi_all_or(_cell->grid->mpi,&ge0);
    } while (ref_subdiv_local._4_4_ == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x1a3,
           "ref_subdiv_mark_relax",(ulong)ref_subdiv_local._4_4_,"mpi all or");
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x17b,
           "ref_subdiv_mark_relax",(ulong)uVar3,"ghost mark");
    ref_subdiv_local._4_4_ = uVar3;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            promote_2_3(3, 4, 5);
            promote_2_3(1, 2, 5);
            promote_2_3(0, 2, 4);
            promote_2_3(0, 1, 3);
            promote_2_all();
            break;
          case 5:
            edge_or(0, 7); /* opposite quad edges */
            edge_or(2, 4); /* opposite quad edges */
            break;
          case 6:
            edge_or(0, 6);
            edge_or(3, 8);
            edge_or(1, 7);
            promote_2_3(0, 1, 3);
            promote_2_3(6, 7, 8);
            break;
          default:
            RSS(REF_IMPLEMENT, "implement cell type");
            break;
        }
      }
    }

    RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                           ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}